

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O0

void __thiscall
feintrack::SimpleLeftObjectsDetector::NewLeftObject
          (SimpleLeftObjectsDetector *this,uint obj_uid,CObjectRegion *region)

{
  int iVar1;
  int iVar2;
  int left;
  int right;
  int top;
  int bottom;
  CLeftObjView local_38;
  CObjectRegion *local_20;
  CObjectRegion *region_local;
  SimpleLeftObjectsDetector *pSStack_10;
  uint obj_uid_local;
  SimpleLeftObjectsDetector *this_local;
  
  iVar1 = this->left_object_time3;
  iVar2 = this->left_object_time1;
  local_20 = region;
  region_local._4_4_ = obj_uid;
  pSStack_10 = this;
  left = CObjectRegion::get_left(region);
  right = CObjectRegion::get_right(local_20);
  top = CObjectRegion::get_top(local_20);
  bottom = CObjectRegion::get_bottom(local_20);
  CLeftObjView::CLeftObjView(&local_38,iVar1 - iVar2,left,right,top,bottom,region_local._4_4_);
  std::__cxx11::list<feintrack::CLeftObjView,_std::allocator<feintrack::CLeftObjView>_>::push_back
            (&this->lefted_objects,&local_38);
  return;
}

Assistant:

void SimpleLeftObjectsDetector::NewLeftObject(
        unsigned int obj_uid,
        const CObjectRegion& region
        )
{
    lefted_objects.push_back(CLeftObjView(left_object_time3 - left_object_time1,
                                          region.get_left(), region.get_right(), region.get_top(), region.get_bottom(),
                                          obj_uid));
}